

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_delphi_generator.cc
# Opt level: O0

void __thiscall
t_delphi_generator::generate_deserialize_field
          (t_delphi_generator *this,ostream *out,bool is_xception,t_field *tfield,string *prefix,
          ostream *param_5)

{
  t_struct *ptVar1;
  byte bVar2;
  uint uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  string *__rhs;
  ostream *poVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 auVar8 [12];
  string local_188;
  undefined1 local_161;
  string local_160;
  t_base local_13c;
  undefined1 local_138 [4];
  t_base tbase;
  string local_118;
  allocator local_f1;
  string local_f0;
  string local_d0;
  string local_b0;
  undefined1 local_90 [8];
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  t_struct *local_40;
  t_type *type;
  ostream *local_vars_local;
  string *prefix_local;
  t_field *tfield_local;
  ostream *poStack_18;
  bool is_xception_local;
  ostream *out_local;
  t_delphi_generator *this_local;
  
  type = (t_type *)param_5;
  local_vars_local = (ostream *)prefix;
  prefix_local = (string *)tfield;
  tfield_local._7_1_ = is_xception;
  poStack_18 = out;
  out_local = (ostream *)this;
  local_40 = (t_struct *)t_field::get_type(tfield);
  while (uVar3 = (*(local_40->super_t_type).super_t_doc._vptr_t_doc[9])(), (uVar3 & 1) != 0) {
    local_40 = (t_struct *)t_typedef::get_type((t_typedef *)local_40);
  }
  uVar3 = (*(local_40->super_t_type).super_t_doc._vptr_t_doc[4])();
  if ((uVar3 & 1) == 0) {
    prop_name_abi_cxx11_(&local_b0,this,(t_field *)prefix_local,(bool)(tfield_local._7_1_ & 1));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                   prefix,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    uVar3 = (*(local_40->super_t_type).super_t_doc._vptr_t_doc[0xb])();
    if (((uVar3 & 1) == 0) &&
       (uVar3 = (*(local_40->super_t_type).super_t_doc._vptr_t_doc[0xc])(), (uVar3 & 1) == 0)) {
      uVar3 = (*(local_40->super_t_type).super_t_doc._vptr_t_doc[0xd])();
      poVar5 = poStack_18;
      bVar2 = tfield_local._7_1_;
      ptVar1 = local_40;
      if ((uVar3 & 1) == 0) {
        uVar3 = (*(local_40->super_t_type).super_t_doc._vptr_t_doc[5])();
        if (((uVar3 & 1) == 0) &&
           (uVar3 = (*(local_40->super_t_type).super_t_doc._vptr_t_doc[10])(), (uVar3 & 1) == 0)) {
          t_field::get_name_abi_cxx11_((t_field *)prefix_local);
          uVar6 = std::__cxx11::string::c_str();
          type_name_abi_cxx11_(&local_188,this,&local_40->super_t_type,false,false,false,false);
          uVar7 = std::__cxx11::string::c_str();
          printf("DO NOT KNOW HOW TO DESERIALIZE FIELD \'%s\' TYPE \'%s\'\n",uVar6,uVar7);
          std::__cxx11::string::~string((string *)&local_188);
        }
        else {
          poVar5 = indent_impl(this,poStack_18);
          poVar5 = std::operator<<(poVar5,(string *)local_90);
          std::operator<<(poVar5," := ");
          uVar3 = (*(local_40->super_t_type).super_t_doc._vptr_t_doc[10])();
          poVar5 = poStack_18;
          if ((uVar3 & 1) != 0) {
            type_name_abi_cxx11_
                      ((string *)local_138,this,&local_40->super_t_type,false,false,false,false);
            poVar5 = std::operator<<(poVar5,(string *)local_138);
            std::operator<<(poVar5,"(");
            std::__cxx11::string::~string((string *)local_138);
          }
          std::operator<<(poStack_18,"iprot.");
          uVar3 = (*(local_40->super_t_type).super_t_doc._vptr_t_doc[5])();
          if ((uVar3 & 1) == 0) {
            uVar3 = (*(local_40->super_t_type).super_t_doc._vptr_t_doc[10])();
            if ((uVar3 & 1) != 0) {
              std::operator<<(poStack_18,"ReadI32()");
              std::operator<<(poStack_18,");");
            }
          }
          else {
            local_13c = t_base_type::get_base((t_base_type *)local_40);
            switch(local_13c) {
            case TYPE_VOID:
              pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       __cxa_allocate_exception(0x20);
              std::operator+(pbVar4,"compiler error: cannot serialize void field in a struct: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_90);
              __cxa_throw(pbVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
            case TYPE_STRING:
              uVar3 = (*(local_40->super_t_type).super_t_doc._vptr_t_doc[7])();
              if ((uVar3 & 1) == 0) {
                std::operator<<(poStack_18,"ReadString();");
              }
              else if ((this->ansistr_binary_ & 1U) == 0) {
                std::operator<<(poStack_18,"ReadBinary();");
              }
              else {
                std::operator<<(poStack_18,"ReadAnsiString();");
              }
              break;
            case TYPE_BOOL:
              std::operator<<(poStack_18,"ReadBool();");
              break;
            case TYPE_I8:
              std::operator<<(poStack_18,"ReadByte();");
              break;
            case TYPE_I16:
              std::operator<<(poStack_18,"ReadI16();");
              break;
            case TYPE_I32:
              std::operator<<(poStack_18,"ReadI32();");
              break;
            case TYPE_I64:
              std::operator<<(poStack_18,"ReadI64();");
              break;
            case TYPE_DOUBLE:
              std::operator<<(poStack_18,"ReadDouble();");
              break;
            default:
              local_161 = 1;
              auVar8 = __cxa_allocate_exception(0x20);
              t_base_type::t_base_name_abi_cxx11_
                        (&local_160,(t_base_type *)(ulong)local_13c,auVar8._8_4_);
              std::operator+(auVar8._0_8_,"compiler error: no Delphi name for base type ",&local_160
                            );
              local_161 = 0;
              __cxa_throw(auVar8._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string
                         );
            }
          }
          std::operator<<(poStack_18,(string *)&::endl_abi_cxx11_);
        }
      }
      else {
        std::__cxx11::string::string((string *)&local_118,(string *)local_90);
        generate_deserialize_container
                  (this,poVar5,(bool)(bVar2 & 1),&ptVar1->super_t_type,&local_118,(ostream *)type);
        std::__cxx11::string::~string((string *)&local_118);
      }
    }
    else {
      poVar5 = poStack_18;
      ptVar1 = local_40;
      std::__cxx11::string::string((string *)&local_d0,(string *)local_90);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_f0,"",&local_f1);
      generate_deserialize_struct(this,poVar5,ptVar1,&local_d0,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_f1);
      std::__cxx11::string::~string((string *)&local_d0);
    }
    std::__cxx11::string::~string((string *)local_90);
    return;
  }
  name.field_2._M_local_buf[0xb] = '\x01';
  pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
  std::operator+(&local_60,"CANNOT GENERATE DESERIALIZE CODE FOR void TYPE: ",prefix);
  __rhs = t_field::get_name_abi_cxx11_((t_field *)prefix_local);
  std::operator+(pbVar4,&local_60,__rhs);
  name.field_2._M_local_buf[0xb] = '\0';
  __cxa_throw(pbVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void t_delphi_generator::generate_deserialize_field(ostream& out,
                                                    bool is_xception,
                                                    t_field* tfield,
                                                    string prefix,
                                                    ostream& local_vars) {
  t_type* type = tfield->get_type();
  while (type->is_typedef()) {
    type = ((t_typedef*)type)->get_type();
  }

  if (type->is_void()) {
    throw "CANNOT GENERATE DESERIALIZE CODE FOR void TYPE: " + prefix + tfield->get_name();
  }

  string name = prefix + prop_name(tfield, is_xception);

  if (type->is_struct() || type->is_xception()) {
    generate_deserialize_struct(out, (t_struct*)type, name, "");
  } else if (type->is_container()) {
    generate_deserialize_container(out, is_xception, type, name, local_vars);
  } else if (type->is_base_type() || type->is_enum()) {
    indent_impl(out) << name << " := ";

    if (type->is_enum()) {
      out << type_name(type, false) << "(";
    }

    out << "iprot.";

    if (type->is_base_type()) {
      t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
      switch (tbase) {
      case t_base_type::TYPE_VOID:
        throw "compiler error: cannot serialize void field in a struct: " + name;
        break;
      case t_base_type::TYPE_STRING:
        if (type->is_binary()) {
          if (ansistr_binary_) {
            out << "ReadAnsiString();";
          } else {
            out << "ReadBinary();";
          }
        } else {
          out << "ReadString();";
        }
        break;
      case t_base_type::TYPE_BOOL:
        out << "ReadBool();";
        break;
      case t_base_type::TYPE_I8:
        out << "ReadByte();";
        break;
      case t_base_type::TYPE_I16:
        out << "ReadI16();";
        break;
      case t_base_type::TYPE_I32:
        out << "ReadI32();";
        break;
      case t_base_type::TYPE_I64:
        out << "ReadI64();";
        break;
      case t_base_type::TYPE_DOUBLE:
        out << "ReadDouble();";
        break;
      default:
        throw "compiler error: no Delphi name for base type " + t_base_type::t_base_name(tbase);
      }
    } else if (type->is_enum()) {
      out << "ReadI32()";
      out << ");";
    }
    out << endl;
  } else {
    printf("DO NOT KNOW HOW TO DESERIALIZE FIELD '%s' TYPE '%s'\n",
           tfield->get_name().c_str(),
           type_name(type).c_str());
  }
}